

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O3

bool __thiscall pg::QPTSolver::lift(QPTSolver *this,int v,int target)

{
  _func_int *p_Var1;
  int *piVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  Game *pGVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  pg *ppVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  pg *ppVar17;
  _label_vertex *p_Var18;
  pg *this_00;
  int iVar19;
  int iVar20;
  ulong in_R8;
  pg *ppVar21;
  int to;
  ulong uVar22;
  bool bVar23;
  pg apStack_d0 [8];
  pg apStack_c8 [8];
  pg apStack_c0 [8];
  pg apStack_b8 [8];
  _label_vertex local_b0;
  ulong local_a0;
  ulong local_98;
  _label_vertex local_90;
  undefined1 *local_80;
  int local_74;
  pg *local_70;
  int local_64;
  _label_vertex local_60;
  pg *local_50;
  int local_44;
  ulong local_40;
  int local_38;
  uint local_34;
  
  iVar14 = this->k * v;
  uVar10 = this->pm_nodes[iVar14];
  if ((uVar10 != 0xffffffff) && ((uVar10 & 1) == this->pl)) {
    return false;
  }
  uVar22 = (ulong)v;
  local_38 = v;
  local_50 = (pg *)(this->pm_nodes + iVar14);
  ppVar21 = apStack_b8 + -((ulong)(uint)this->k * 4 + 0xf & 0xfffffffffffffff0);
  local_64 = ((this->super_Solver).game)->_priority[uVar22];
  ppVar13 = ppVar21 + -((ulong)(uint)this->k * 4 + 0xf & 0xfffffffffffffff0);
  local_70 = ppVar13;
  local_80 = apStack_b8;
  local_74 = this->strategy[uVar22];
  if (1 < (this->super_Solver).trace) {
    poVar5 = (this->super_Solver).logger;
    *(undefined8 *)(ppVar13 + -8) = 0x1682ec;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[37;1mupdating vertex ",0x17);
    local_60.g = (this->super_Solver).game;
    local_60.v = v;
    *(undefined8 *)(ppVar13 + -8) = 0x168303;
    poVar5 = operator<<(poVar5,&local_60);
    pcVar16 = " (odd)";
    bVar23 = ((((this->super_Solver).game)->_owner)._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0;
    if (!bVar23) {
      pcVar16 = " (even)";
    }
    *(undefined8 *)(ppVar13 + -8) = 0x168340;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar16,7 - (ulong)bVar23);
    *(undefined8 *)(ppVar13 + -8) = 0x168354;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m with current measure",0x18);
    ppVar17 = local_50;
    poVar5 = (this->super_Solver).logger;
    iVar14 = this->k;
    *(undefined8 *)(ppVar13 + -8) = 0x168364;
    pm_stream(poVar5,(int *)ppVar17,iVar14);
    poVar5 = (this->super_Solver).logger;
    p_Var1 = poVar5->_vptr_basic_ostream[-3];
    cVar3 = (char)poVar5;
    *(undefined8 *)(ppVar13 + -8) = 0x16837c;
    std::ios::widen((char)p_Var1 + cVar3);
    *(undefined8 *)(ppVar13 + -8) = 0x16838e;
    std::ostream::put(cVar3);
    *(undefined8 *)(ppVar13 + -8) = 0x168396;
    std::ostream::flush();
  }
  iVar14 = local_64;
  if (target == -1) {
    piVar8 = this->strategy;
    iVar4 = piVar8[uVar22];
  }
  else {
    bVar23 = ((((this->super_Solver).game)->_owner)._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0;
    if (this->pl == (uint)bVar23) {
      iVar4 = this->k;
      iVar19 = this->max;
      iVar20 = this->maxo;
      local_40 = uVar22;
      piVar8 = this->pm_nodes;
      *(ulong *)(ppVar13 + -0x10) = (ulong)bVar23;
      *(undefined8 *)(ppVar13 + -0x18) = 0x1683f5;
      au((int *)ppVar21,piVar8 + iVar4 * target,iVar14,iVar4,iVar19,iVar20,*(int *)(ppVar13 + -0x10)
        );
      uVar22 = (ulong)this->k;
      uVar10 = this->pl;
      if (0 < (long)uVar22) {
        uVar6 = 0;
        uVar15 = 0;
        do {
          lVar7 = uVar6 * 4;
          uVar6 = uVar6 + 1;
          uVar15 = (ulong)((*(uint *)(ppVar21 + lVar7) & 1) == uVar10 &&
                          *(uint *)(ppVar21 + lVar7) != 0xffffffff) + uVar15 * 2;
        } while (uVar22 != uVar6);
        if (this->goal < uVar15) {
          *(int *)ppVar21 = this->max;
        }
      }
      if (1 < (this->super_Solver).trace) {
        poVar5 = (this->super_Solver).logger;
        *(undefined8 *)(ppVar13 + -8) = 0x16845f;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"to successor ",0xd);
        local_60.g = (this->super_Solver).game;
        local_60.v = target;
        *(undefined8 *)(ppVar13 + -8) = 0x168476;
        poVar5 = operator<<(poVar5,&local_60);
        *(undefined8 *)(ppVar13 + -8) = 0x16848a;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
        iVar14 = this->k;
        poVar5 = (this->super_Solver).logger;
        piVar8 = this->pm_nodes;
        *(undefined8 *)(ppVar13 + -8) = 0x1684a7;
        pm_stream(poVar5,piVar8 + iVar14 * target,iVar14);
        poVar5 = (this->super_Solver).logger;
        *(undefined8 *)(ppVar13 + -8) = 0x1684bc;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," => ",4);
        poVar5 = (this->super_Solver).logger;
        iVar14 = this->k;
        *(undefined8 *)(ppVar13 + -8) = 0x1684cb;
        pm_stream(poVar5,(int *)ppVar21,iVar14);
        poVar5 = (this->super_Solver).logger;
        p_Var1 = poVar5->_vptr_basic_ostream[-3];
        cVar3 = (char)poVar5;
        *(undefined8 *)(ppVar13 + -8) = 0x1684e3;
        std::ios::widen((char)p_Var1 + cVar3);
        *(undefined8 *)(ppVar13 + -8) = 0x1684ee;
        std::ostream::put(cVar3);
        *(undefined8 *)(ppVar13 + -8) = 0x1684f6;
        std::ostream::flush();
        uVar10 = this->pl;
        uVar22 = (ulong)(uint)this->k;
      }
      ppVar17 = local_50;
      *(undefined8 *)(ppVar13 + -8) = 0x16850c;
      bVar23 = pm_less(ppVar17,(int *)ppVar21,(int *)(uVar22 & 0xffffffff),uVar10,iVar19);
      if (!bVar23) {
        return false;
      }
      local_34 = target;
      if (0 < (int)uVar22) {
        lVar7 = 0;
        do {
          *(undefined4 *)(local_50 + lVar7 * 4) = *(undefined4 *)(ppVar21 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->k);
      }
      uVar22 = local_40;
      if (((this->super_Solver).trace != 0) && (iVar14 = this->strategy[local_40], iVar14 != target)
         ) {
        poVar5 = (this->super_Solver).logger;
        *(undefined8 *)(ppVar13 + -8) = 0x16856b;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;38;5;208m",0xd);
        poVar5 = (this->super_Solver).logger;
        if (iVar14 == -1) {
          *(undefined8 *)(ppVar13 + -8) = 0x168e0c;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"set strategy\x1b[m of \x1b[36;1m",0x1a);
          local_60.g = (this->super_Solver).game;
          local_60.v = local_38;
          *(undefined8 *)(ppVar13 + -8) = 0x168e25;
          poVar5 = operator<<(poVar5,&local_60);
          *(undefined8 *)(ppVar13 + -8) = 0x168e3c;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m to \x1b[36;1m",0xe);
          local_90.g = (this->super_Solver).game;
          local_90.v = local_34;
          *(undefined8 *)(ppVar13 + -8) = 0x168e58;
          poVar5 = operator<<(poVar5,&local_90);
          *(undefined8 *)(ppVar13 + -8) = 0x168e6c;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m\n",4);
          uVar22 = local_40;
        }
        else {
          *(undefined8 *)(ppVar13 + -8) = 0x16858d;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"changed strategy\x1b[m of \x1b[36;1m",0x1e);
          uVar22 = local_40;
          local_60.g = (this->super_Solver).game;
          local_60.v = (int)local_40;
          *(undefined8 *)(ppVar13 + -8) = 0x1685a8;
          poVar5 = operator<<(poVar5,&local_60);
          *(undefined8 *)(ppVar13 + -8) = 0x1685bf;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m from \x1b[36;1m",0x10);
          local_90.g = (this->super_Solver).game;
          local_90.v = this->strategy[uVar22];
          *(undefined8 *)(ppVar13 + -8) = 0x1685e0;
          poVar5 = operator<<(poVar5,&local_90);
          *(undefined8 *)(ppVar13 + -8) = 0x1685f7;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m to \x1b[36;1m",0xe);
          local_b0.g = (this->super_Solver).game;
          local_b0.v = local_34;
          *(undefined8 *)(ppVar13 + -8) = 0x168616;
          poVar5 = operator<<(poVar5,&local_b0);
          *(undefined8 *)(ppVar13 + -8) = 0x16862a;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m\n",4);
        }
      }
      uVar10 = local_34;
      this->strategy[uVar22] = local_34;
      if ((this->super_Solver).trace != 0) {
        poVar5 = (this->super_Solver).logger;
        *(undefined8 *)(ppVar13 + -8) = 0x168ea1;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m",0x20);
        local_60.g = (this->super_Solver).game;
        local_60.v = local_38;
        *(undefined8 *)(ppVar13 + -8) = 0x168ebe;
        poVar5 = operator<<(poVar5,&local_60);
        *(undefined8 *)(ppVar13 + -8) = 0x168ed2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m:",4);
        ppVar21 = local_50;
        poVar5 = (this->super_Solver).logger;
        iVar14 = this->k;
        *(undefined8 *)(ppVar13 + -8) = 0x168ee2;
        pm_stream(poVar5,(int *)ppVar21,iVar14);
        poVar5 = (this->super_Solver).logger;
        *(undefined8 *)(ppVar13 + -8) = 0x168efa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (to ",5);
        local_60.g = (this->super_Solver).game;
        local_60.v = uVar10;
        *(undefined8 *)(ppVar13 + -8) = 0x168f11;
        poVar5 = operator<<(poVar5,&local_60);
        *(undefined8 *)(ppVar13 + -8) = 0x168f25;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
        return true;
      }
      return true;
    }
    iVar4 = this->strategy[uVar22];
    piVar8 = (int *)CONCAT71((int7)((ulong)this->strategy >> 8),iVar4 != -1);
    if (iVar4 != -1 && iVar4 != target) {
      return false;
    }
  }
  local_44 = iVar4;
  local_34 = (uint)CONCAT71((int7)((ulong)piVar8 >> 8),iVar4 == -1);
  if (iVar4 != -1) {
    iVar19 = this->k;
    uVar10 = this->max;
    in_R8 = (ulong)uVar10;
    iVar20 = this->maxo;
    piVar8 = this->pm_nodes;
    *(ulong *)(ppVar13 + -0x10) = (ulong)(uint)this->pl;
    *(undefined8 *)(ppVar13 + -0x18) = 0x16869b;
    au((int *)ppVar21,piVar8 + iVar19 * iVar4,iVar14,iVar19,uVar10,iVar20,*(int *)(ppVar13 + -0x10))
    ;
    uVar10 = this->k;
    if (0 < (long)(int)uVar10) {
      lVar7 = 0;
      uVar15 = 0;
      do {
        uVar12 = *(uint *)(ppVar21 + lVar7 * 4);
        in_R8 = CONCAT71((int7)(in_R8 >> 8),uVar12 != 0xffffffff);
        lVar7 = lVar7 + 1;
        uVar15 = (ulong)((uVar12 & 1) == this->pl && uVar12 != 0xffffffff) + uVar15 * 2;
      } while ((int)uVar10 != lVar7);
      if (this->goal < uVar15) {
        *(int *)ppVar21 = this->max;
      }
    }
    if (1 < (this->super_Solver).trace) {
      poVar5 = (this->super_Solver).logger;
      *(undefined8 *)(ppVar13 + -8) = 0x168705;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"to successor ",0xd);
      local_60.g = (this->super_Solver).game;
      local_60.v = local_44;
      *(undefined8 *)(ppVar13 + -8) = 0x16871e;
      poVar5 = operator<<(poVar5,&local_60);
      *(undefined8 *)(ppVar13 + -8) = 0x168732;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      iVar14 = this->k;
      poVar5 = (this->super_Solver).logger;
      iVar4 = iVar14 * local_44;
      piVar8 = this->pm_nodes;
      *(undefined8 *)(ppVar13 + -8) = 0x16874f;
      pm_stream(poVar5,piVar8 + iVar4,iVar14);
      poVar5 = (this->super_Solver).logger;
      *(undefined8 *)(ppVar13 + -8) = 0x168764;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," => ",4);
      poVar5 = (this->super_Solver).logger;
      iVar14 = this->k;
      *(undefined8 *)(ppVar13 + -8) = 0x168773;
      pm_stream(poVar5,(int *)ppVar21,iVar14);
      poVar5 = (this->super_Solver).logger;
      p_Var1 = poVar5->_vptr_basic_ostream[-3];
      cVar3 = (char)poVar5;
      *(undefined8 *)(ppVar13 + -8) = 0x16878b;
      std::ios::widen((char)p_Var1 + cVar3);
      iVar4 = local_44;
      *(undefined8 *)(ppVar13 + -8) = 0x16879a;
      std::ostream::put(cVar3);
      *(undefined8 *)(ppVar13 + -8) = 0x1687a2;
      std::ostream::flush();
      uVar10 = this->k;
    }
    ppVar17 = local_70;
    if (0 < (int)uVar10) {
      *(undefined8 *)(ppVar13 + -8) = 0x1687bb;
      memcpy(ppVar17,ppVar21,(ulong)uVar10 << 2);
    }
  }
  iVar20 = (int)in_R8;
  pGVar9 = (this->super_Solver).game;
  local_40 = uVar22;
  piVar8 = pGVar9->_outedges;
  iVar14 = pGVar9->_firstouts[uVar22];
  iVar19 = piVar8[iVar14];
  if (iVar19 != -1) {
    piVar8 = piVar8 + iVar14;
    local_a0 = uVar22 >> 6;
    local_98 = 1L << (uVar22 & 0x3f);
    do {
      iVar14 = local_64;
      if ((iVar19 != iVar4) &&
         ((1L << ((long)iVar19 & 0x3fU) &
          ((this->super_Solver).disabled)->_bits[(ulong)(long)iVar19 >> 6]) == 0)) {
        iVar4 = this->k;
        uVar10 = this->max;
        in_R8 = (ulong)uVar10;
        iVar20 = this->maxo;
        piVar2 = this->pm_nodes;
        *(ulong *)(ppVar13 + -0x10) = (ulong)(uint)this->pl;
        *(undefined8 *)(ppVar13 + -0x18) = 0x16885e;
        au((int *)ppVar21,piVar2 + iVar4 * iVar19,iVar14,iVar4,uVar10,iVar20,
           *(int *)(ppVar13 + -0x10));
        if (0 < (long)this->k) {
          lVar7 = 0;
          uVar22 = 0;
          do {
            uVar10 = *(uint *)(ppVar21 + lVar7 * 4);
            in_R8 = CONCAT71((int7)(in_R8 >> 8),uVar10 != 0xffffffff);
            lVar7 = lVar7 + 1;
            uVar22 = (ulong)((uVar10 & 1) == this->pl && uVar10 != 0xffffffff) + uVar22 * 2;
          } while (this->k != lVar7);
          if (this->goal < uVar22) {
            *(int *)ppVar21 = this->max;
          }
        }
        if (1 < (this->super_Solver).trace) {
          poVar5 = (this->super_Solver).logger;
          *(undefined8 *)(ppVar13 + -8) = 0x1688c8;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"to successor ",0xd);
          local_60.g = (this->super_Solver).game;
          local_60.v = iVar19;
          *(undefined8 *)(ppVar13 + -8) = 0x1688e0;
          poVar5 = operator<<(poVar5,&local_60);
          *(undefined8 *)(ppVar13 + -8) = 0x1688f4;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
          iVar14 = this->k;
          poVar5 = (this->super_Solver).logger;
          piVar2 = this->pm_nodes;
          *(undefined8 *)(ppVar13 + -8) = 0x168911;
          pm_stream(poVar5,piVar2 + iVar14 * iVar19,iVar14);
          poVar5 = (this->super_Solver).logger;
          *(undefined8 *)(ppVar13 + -8) = 0x168926;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," => ",4);
          poVar5 = (this->super_Solver).logger;
          iVar14 = this->k;
          *(undefined8 *)(ppVar13 + -8) = 0x168935;
          pm_stream(poVar5,(int *)ppVar21,iVar14);
          poVar5 = (this->super_Solver).logger;
          p_Var1 = poVar5->_vptr_basic_ostream[-3];
          cVar3 = (char)poVar5;
          *(undefined8 *)(ppVar13 + -8) = 0x16894d;
          std::ios::widen((char)p_Var1 + cVar3);
          *(undefined8 *)(ppVar13 + -8) = 0x168958;
          std::ostream::put(cVar3);
          *(undefined8 *)(ppVar13 + -8) = 0x168960;
          std::ostream::flush();
        }
        if ((local_34 & 1) == 0) {
          uVar10 = this->k;
          uVar12 = this->pl;
          uVar11 = (uint)(((((this->super_Solver).game)->_owner)._bits[local_a0] & local_98) != 0);
          ppVar17 = local_70;
          this_00 = ppVar21;
          if (uVar12 == uVar11) {
            ppVar17 = ppVar21;
            this_00 = local_70;
            uVar12 = uVar11;
          }
          *(undefined8 *)(ppVar13 + -8) = 0x1689b3;
          bVar23 = pm_less(this_00,(int *)ppVar17,(int *)(ulong)uVar10,uVar12,(int)in_R8);
          if (bVar23) goto LAB_001689b7;
        }
        else {
          uVar10 = this->k;
LAB_001689b7:
          ppVar17 = local_70;
          if (0 < (int)uVar10) {
            *(undefined8 *)(ppVar13 + -8) = 0x1689cf;
            memcpy(ppVar17,ppVar21,(ulong)uVar10 << 2);
          }
          this->strategy[local_40] = iVar19;
        }
        local_34 = 0;
        iVar4 = local_44;
      }
      iVar20 = (int)in_R8;
      iVar19 = piVar8[1];
      piVar8 = piVar8 + 1;
    } while (iVar19 != -1);
  }
  ppVar17 = local_50;
  ppVar21 = local_70;
  uVar10 = this->pl;
  uVar12 = this->k;
  *(undefined8 *)(ppVar13 + -8) = 0x168a13;
  bVar23 = pm_less(ppVar17,(int *)ppVar21,(int *)(ulong)uVar12,uVar10,iVar20);
  iVar14 = local_74;
  if (!bVar23) {
    if (((this->super_Solver).trace != 0) && (local_74 != this->strategy[local_40])) {
      poVar5 = (this->super_Solver).logger;
      if (uVar10 == (((((this->super_Solver).game)->_owner)._bits[local_40 >> 6] >>
                      (local_40 & 0x3f) & 1) != 0)) {
        pcVar16 = "\x1b[1;38;5;208m";
        lVar7 = 0xd;
      }
      else {
        pcVar16 = "\x1b[1;31m";
        lVar7 = 7;
      }
      *(undefined8 *)(ppVar13 + -8) = 0x168ba7;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar16,lVar7);
      poVar5 = (this->super_Solver).logger;
      if (iVar14 == -1) {
        *(undefined8 *)(ppVar13 + -8) = 0x168d88;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"set strategy\x1b[m of \x1b[36;1m",0x1a);
        local_60.g = (this->super_Solver).game;
        local_60.v = local_38;
        *(undefined8 *)(ppVar13 + -8) = 0x168da1;
        poVar5 = operator<<(poVar5,&local_60);
        *(undefined8 *)(ppVar13 + -8) = 0x168db8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m to \x1b[36;1m",0xe);
        piVar8 = this->strategy;
        pGVar9 = (this->super_Solver).game;
        p_Var18 = &local_90;
      }
      else {
        *(undefined8 *)(ppVar13 + -8) = 0x168bc9;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"changed strategy\x1b[m of \x1b[36;1m",0x1e);
        local_60.g = (this->super_Solver).game;
        local_60.v = local_38;
        *(undefined8 *)(ppVar13 + -8) = 0x168be2;
        poVar5 = operator<<(poVar5,&local_60);
        *(undefined8 *)(ppVar13 + -8) = 0x168bf9;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m from \x1b[36;1m",0x10);
        local_90.g = (this->super_Solver).game;
        local_90.v = iVar14;
        *(undefined8 *)(ppVar13 + -8) = 0x168c13;
        poVar5 = operator<<(poVar5,&local_90);
        *(undefined8 *)(ppVar13 + -8) = 0x168c2a;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m to \x1b[36;1m",0xe);
        piVar8 = this->strategy;
        pGVar9 = (this->super_Solver).game;
        p_Var18 = &local_b0;
      }
      iVar14 = piVar8[local_40];
      p_Var18->g = pGVar9;
      p_Var18->v = iVar14;
      *(undefined8 *)(ppVar13 + -8) = 0x168ddc;
      poVar5 = operator<<(poVar5,p_Var18);
      *(undefined8 *)(ppVar13 + -8) = 0x168df0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m\n",4);
    }
    return false;
  }
  if (0 < (int)uVar12) {
    lVar7 = 0;
    do {
      *(undefined4 *)(local_50 + lVar7 * 4) = *(undefined4 *)(local_70 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->k);
  }
  if ((this->super_Solver).trace != 0) {
    if (local_74 != this->strategy[local_40]) {
      poVar5 = (this->super_Solver).logger;
      if (this->pl ==
          (uint)(((((this->super_Solver).game)->_owner)._bits[local_40 >> 6] >> (local_40 & 0x3f) &
                 1) != 0)) {
        pcVar16 = "\x1b[1;38;5;208m";
        lVar7 = 0xd;
      }
      else {
        pcVar16 = "\x1b[1;31m";
        lVar7 = 7;
      }
      *(undefined8 *)(ppVar13 + -8) = 0x168afb;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar16,lVar7);
      poVar5 = (this->super_Solver).logger;
      if (iVar14 == -1) {
        *(undefined8 *)(ppVar13 + -8) = 0x168c56;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"set strategy\x1b[m of \x1b[36;1m",0x1a);
        local_60.g = (this->super_Solver).game;
        local_60.v = local_38;
        *(undefined8 *)(ppVar13 + -8) = 0x168c6f;
        poVar5 = operator<<(poVar5,&local_60);
        *(undefined8 *)(ppVar13 + -8) = 0x168c86;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m to \x1b[36;1m",0xe);
        piVar8 = this->strategy;
        pGVar9 = (this->super_Solver).game;
        p_Var18 = &local_90;
      }
      else {
        *(undefined8 *)(ppVar13 + -8) = 0x168b1d;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"changed strategy\x1b[m of \x1b[36;1m",0x1e);
        local_60.g = (this->super_Solver).game;
        local_60.v = local_38;
        *(undefined8 *)(ppVar13 + -8) = 0x168b36;
        poVar5 = operator<<(poVar5,&local_60);
        *(undefined8 *)(ppVar13 + -8) = 0x168b4d;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m from \x1b[36;1m",0x10);
        local_90.g = (this->super_Solver).game;
        local_90.v = iVar14;
        *(undefined8 *)(ppVar13 + -8) = 0x168b67;
        poVar5 = operator<<(poVar5,&local_90);
        *(undefined8 *)(ppVar13 + -8) = 0x168b7e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m to \x1b[36;1m",0xe);
        piVar8 = this->strategy;
        pGVar9 = (this->super_Solver).game;
        p_Var18 = &local_b0;
      }
      iVar14 = piVar8[local_40];
      p_Var18->g = pGVar9;
      p_Var18->v = iVar14;
      *(undefined8 *)(ppVar13 + -8) = 0x168caa;
      poVar5 = operator<<(poVar5,p_Var18);
      *(undefined8 *)(ppVar13 + -8) = 0x168cbe;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m\n",4);
    }
    if ((this->super_Solver).trace != 0) {
      poVar5 = (this->super_Solver).logger;
      *(undefined8 *)(ppVar13 + -8) = 0x168ce0;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m",0x20);
      local_60.g = (this->super_Solver).game;
      local_60.v = local_38;
      *(undefined8 *)(ppVar13 + -8) = 0x168cfd;
      poVar5 = operator<<(poVar5,&local_60);
      *(undefined8 *)(ppVar13 + -8) = 0x168d11;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m:",4);
      ppVar21 = local_50;
      poVar5 = (this->super_Solver).logger;
      iVar14 = this->k;
      *(undefined8 *)(ppVar13 + -8) = 0x168d21;
      pm_stream(poVar5,(int *)ppVar21,iVar14);
      poVar5 = (this->super_Solver).logger;
      *(undefined8 *)(ppVar13 + -8) = 0x168d39;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (to ",5);
      local_60.g = (this->super_Solver).game;
      local_60.v = this->strategy[local_40];
      *(undefined8 *)(ppVar13 + -8) = 0x168d5b;
      poVar5 = operator<<(poVar5,&local_60);
      *(undefined8 *)(ppVar13 + -8) = 0x168d6f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool
QPTSolver::lift(int v, int target)
{
    // check if already Top
    int * const pm = pm_nodes + k*v; // obtain ptr to current progress measure
    if (pm[0] != -1 and (pm[0]&1) == pl) return false;

    const int pr = priority(v);
    int tmp[k], res[k];

#ifndef NDEBUG
    int old_strategy = strategy[v];

    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        pm_stream(logger, pm, k);
        logger << std::endl;
    }
#endif

    // First special cases if we are lifting triggered by a given <target>.

    if (1 and target != -1) {
        if (owner(v) == pl) {
            // if owned by <pl>, just check if target is better.
            au(tmp, pm_nodes + k*target, pr, k, max, maxo, pl);
            if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // lol
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                pm_stream(logger, pm_nodes + k*target, k);
                logger << " => ";
                pm_stream(logger, tmp, k);
                logger << std::endl;
            }
#endif
            if (pm_less(pm, tmp, k, pl)) {
                // target is better, update, report, return
                for (int i=0; i<k; i++) pm[i] = tmp[i];
#ifndef NDEBUG
                if (trace and target != strategy[v]) {
                    if (strategy[v] == -1) {
                        logger << "\033[1;38;5;208m";
                        logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    } else {
                        logger << "\033[1;38;5;208m";
                        logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(strategy[v]) << "\033[m to \033[36;1m" << label_vertex(target) << "\033[m\n";
                    }
                }
                strategy[v] = target; // does not matter for algorithm, only for output here
#endif
#ifndef NDEBUG
                if (trace) {
                    logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                    pm_stream(logger, pm, k);
                    logger << " (to " << label_vertex(target) << ")\n";
                }
#endif
                return true;
            } else {
                // target not better, not checking other directions
                return false;
            }
        } else {
            // if owned by ~<pl>, test if strategy is target
            if (strategy[v] != -1 and target != strategy[v]) {
                return false; // no need to do anything... strategy is still same
            }
        }
    }

    // Compute best measure by going over all successors

    bool first = true;
    int s_cur = strategy[v];
    if (s_cur != -1) {
        // first set to current...
        au(tmp, pm_nodes + k*s_cur, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(s_cur) << ":";
            pm_stream(logger, pm_nodes + k*s_cur, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        for (int i=0; i<k; i++) res[i] = tmp[i];
        first = false;
    }
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        if (to == s_cur) continue;
        au(tmp, pm_nodes + k*to, pr, k, max, maxo, pl);
        if (pm_val(tmp, k, pl) > goal) tmp[0] = max; // goal reached, lift to Top
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << ":";
            pm_stream(logger, pm_nodes + k*to, k);
            logger << " => ";
            pm_stream(logger, tmp, k);
            logger << std::endl;
        }
#endif
        if (first) {
            first = false;
            for (int i=0; i<k; i++) res[i] = tmp[i];
            strategy[v] = to;
        } else if (owner(v) == pl) {
            // we want the max
            if (pm_less(res, tmp, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        } else {
            // we want the min
            if (pm_less(tmp, res, k, pl)) {
                for (int i=0; i<k; i++) res[i] = tmp[i];
                strategy[v] = to;
            }
        }
    }

    // now "res" contains the best au
    if (pm_less(pm, res, k, pl)) {
        // ok, it's an update
        for (int i=0; i<k; i++) pm[i] = res[i];
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
        if (trace) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            pm_stream(logger, pm, k);
            logger << " (to " << label_vertex(strategy[v]) << ")\n";
        }
#endif
        return true;
    } else {
#ifndef NDEBUG
        if (trace and old_strategy != strategy[v]) {
            if (owner(v) == pl) logger << "\033[1;38;5;208m";
            else logger << "\033[1;31m";
            if (old_strategy == -1) {
                logger << "set strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            } else {
                logger << "changed strategy\033[m of \033[36;1m" << label_vertex(v) << "\033[m from \033[36;1m" << label_vertex(old_strategy) << "\033[m to \033[36;1m" << label_vertex(strategy[v]) << "\033[m\n";
            }
        }
#endif
        return false;
    }
}